

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::Result::Result(Result *this,bool passed,String *decomposition)

{
  String *in_RDX;
  byte in_SIL;
  byte *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  *in_RDI = in_SIL & 1;
  String::String((String *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),in_RDX);
  return;
}

Assistant:

Result::Result(bool passed, const String& decomposition)
            : m_passed(passed)
            , m_decomp(decomposition) {}